

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  float *pfVar2;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  long lVar3;
  long lVar4;
  float *this;
  Type in1;
  Type in0;
  Matrix<float,_4,_4> retVal;
  MatrixCaseUtils local_fc [12];
  Mat4 local_f0;
  Mat4 local_b0;
  VecAccess<float,_4,_3> local_70;
  Mat4 local_58;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_b0,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_b0,(float *)sr::(anonymous_namespace)::s_constInMat4x4);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_f0,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix
              (&local_f0,(float *)(sr::(anonymous_namespace)::s_constInMat4x4 + 0x40));
  }
  this = (float *)&local_58;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)this);
  pfVar1 = (float *)&local_f0;
  pfVar2 = (float *)&local_b0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
      *(float *)((long)this + lVar4) =
           *(float *)((long)pfVar2 + lVar4) * *(float *)((long)pfVar1 + lVar4);
    }
    this = this + 1;
    pfVar1 = pfVar1 + 1;
    pfVar2 = pfVar2 + 1;
  }
  reduceToVec3(local_fc,&local_58);
  local_70.m_vector = &evalCtx->color;
  local_70.m_index[0] = 0;
  local_70.m_index[1] = 1;
  local_70.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,(Vector<float,_3> *)local_fc);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}